

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recorder.cpp
# Opt level: O2

ssize_t __thiscall pstore::broker::player::read(player *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined4 in_register_00000034;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_20;
  
  message_pool::get_from_pool((message_pool *)this);
  std::unique_lock<std::mutex>::unique_lock
            (&local_20,(mutex_type *)CONCAT44(in_register_00000034,__fd));
  file::file_base::read<pstore::brokerface::message_type,void>
            ((file_base *)((mutex_type *)CONCAT44(in_register_00000034,__fd) + 1),
             (message_type *)(this->mut_).super___mutex_base._M_mutex.__align);
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return (ssize_t)this;
}

Assistant:

brokerface::message_ptr player::read () {
            brokerface::message_ptr msg = pool.get_from_pool ();
            std::unique_lock<decltype (mut_)> const lock (mut_);
            file_.read (msg.get ());
            return msg;
        }